

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall spirv_cross::DominatorBuilder::add_block(DominatorBuilder *this,uint32_t block)

{
  uint32_t uVar1;
  uint32_t block_local;
  DominatorBuilder *this_local;
  
  uVar1 = CFG::get_immediate_dominator(this->cfg,block);
  if (uVar1 != 0) {
    if (this->dominator == 0) {
      this->dominator = block;
    }
    else if (block != this->dominator) {
      uVar1 = CFG::find_common_dominator(this->cfg,block,this->dominator);
      this->dominator = uVar1;
    }
  }
  return;
}

Assistant:

void DominatorBuilder::add_block(uint32_t block)
{
	if (!cfg.get_immediate_dominator(block))
	{
		// Unreachable block via the CFG, we will never emit this code anyways.
		return;
	}

	if (!dominator)
	{
		dominator = block;
		return;
	}

	if (block != dominator)
		dominator = cfg.find_common_dominator(block, dominator);
}